

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void __thiscall
AssemblyCode::MoveRegToMemByReg::MoveRegToMemByReg
          (MoveRegToMemByReg *this,CTemp *target,CTemp *source)

{
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_0017d008;
  std::__cxx11::string::string((string *)&this->target,(string *)target);
  std::__cxx11::string::string((string *)&this->source,(string *)source);
  return;
}

Assistant:

AssemblyCode::MoveRegToMemByReg::MoveRegToMemByReg( const IRT::CTemp &target, const IRT::CTemp &source ) : target(
        target ), source( source ) { }